

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

void __thiscall
testing::internal::
FlatTupleBase<testing::internal::FlatTuple<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>
::
FlatTupleBase<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>
          (FlatTupleBase<testing::internal::FlatTuple<prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType,prometheus::MetricType>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>
           *this,undefined8 param_2,undefined8 param_3,undefined8 param_4,undefined8 param_5,
          undefined8 param_6,undefined8 param_7)

{
  MetricType *args_local_4;
  MetricType *args_local_3;
  MetricType *args_local_2;
  MetricType *args_local_1;
  MetricType *args_local;
  FlatTupleBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL,_5UL>_>
  *this_local;
  
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_0UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_0UL>
              *)this,param_2);
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_1UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_1UL>
              *)(this + 4),param_3);
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_2UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_2UL>
              *)(this + 8),param_4);
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_3UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_3UL>
              *)(this + 0xc),param_5);
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_4UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_4UL>
              *)(this + 0x10),param_6);
  FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_5UL>
  ::FlatTupleElemBase<prometheus::MetricType>
            ((FlatTupleElemBase<testing::internal::FlatTuple<prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType,_prometheus::MetricType>,_5UL>
              *)(this + 0x14),param_7);
  return;
}

Assistant:

explicit FlatTupleBase(FlatTupleConstructTag, Args&&... args)
      : FlatTupleElemBase<FlatTuple<T...>, Idx>(FlatTupleConstructTag{},
                                                std::forward<Args>(args))... {}